

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcEdgeLogLikelihoodsSecondDerivByPartition
          (BeagleCPUImpl<float,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *firstDerivativeIndices,int *secondDerivativeIndices,
          int *categoryWeightsIndices,int *stateFrequenciesIndices,int *cumulativeScaleIndices,
          int *partitionIndices,int partitionCount,double *outSumLogLikelihoodByPartition,
          double *outSumFirstDerivativeByPartition,double *outSumSecondDerivativeByPartition)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  float **ppfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  int *piVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  double *pdVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  int i;
  float *pfVar32;
  int iVar33;
  long lVar34;
  ulong uVar35;
  float *pfVar36;
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  double dVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_ZMM1 [64];
  double dVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined8 in_XMM4_Qb;
  undefined1 auVar54 [16];
  undefined8 in_XMM6_Qb;
  int local_104;
  
  for (uVar35 = 0; uVar35 != (uint)(~(partitionCount >> 0x1f) & partitionCount); uVar35 = uVar35 + 1
      ) {
    local_104 = this->gPatternPartitionsStartPatterns[partitionIndices[uVar35]];
    iVar4 = this->gPatternPartitionsStartPatterns[(long)partitionIndices[uVar35] + 1];
    lVar29 = (long)iVar4;
    lVar24 = (long)local_104;
    iVar26 = iVar4 - local_104;
    memset(this->integrationTmp + this->kStateCount * local_104,0,
           (long)(this->kStateCount * iVar26) << 2);
    memset(this->firstDerivTmp + this->kStateCount * local_104,0,
           (long)(this->kStateCount * iVar26) << 2);
    memset(this->secondDerivTmp + this->kStateCount * local_104,0,
           (long)(iVar26 * this->kStateCount) << 2);
    ppfVar8 = this->gTransitionMatrices;
    iVar26 = cumulativeScaleIndices[uVar35];
    pfVar9 = ppfVar8[firstDerivativeIndices[uVar35]];
    pfVar10 = ppfVar8[secondDerivativeIndices[uVar35]];
    pfVar11 = ppfVar8[probabilityIndices[uVar35]];
    iVar5 = childBufferIndices[uVar35];
    pfVar12 = this->gCategoryWeights[categoryWeightsIndices[uVar35]];
    pfVar13 = this->gStateFrequencies[stateFrequenciesIndices[uVar35]];
    pfVar14 = this->gPartials[parentBufferIndices[uVar35]];
    if ((iVar5 < this->kTipCount) && (piVar15 = this->gTipStates[iVar5], piVar15 != (int *)0x0)) {
      uVar21 = this->kStateCount;
      iVar5 = this->kPartialsPaddedStateCount;
      uVar6 = this->kCategoryCount;
      iVar33 = iVar5 * local_104;
      iVar7 = this->kPatternCount;
      for (uVar23 = 0; uVar23 != (~((int)uVar6 >> 0x1f) & uVar6); uVar23 = uVar23 + 1) {
        iVar20 = this->kMatrixSize;
        lVar34 = (long)iVar33;
        fVar43 = pfVar12[uVar23];
        pfVar36 = pfVar14 + lVar34;
        iVar33 = uVar21 * local_104;
        for (lVar28 = lVar24; lVar28 < lVar29; lVar28 = lVar28 + 1) {
          pfVar32 = this->integrationTmp;
          pfVar16 = this->firstDerivTmp;
          iVar27 = this->kTransPaddedStateCount;
          lVar30 = (long)piVar15[lVar28] + (long)(iVar20 * (int)uVar23);
          pfVar17 = this->secondDerivTmp;
          for (uVar22 = 0; (~((int)uVar21 >> 0x1f) & uVar21) != uVar22; uVar22 = uVar22 + 1) {
            auVar38 = vfmadd213ss_fma(ZEXT416((uint)(pfVar11[lVar30] * pfVar36[uVar22])),
                                      ZEXT416((uint)fVar43),
                                      ZEXT416((uint)pfVar32[(long)iVar33 + uVar22]));
            pfVar32[(long)iVar33 + uVar22] = auVar38._0_4_;
            auVar38 = vfmadd213ss_fma(ZEXT416((uint)(pfVar9[lVar30] * pfVar36[uVar22])),
                                      ZEXT416((uint)fVar43),
                                      ZEXT416((uint)pfVar16[(long)iVar33 + uVar22]));
            pfVar16[(long)iVar33 + uVar22] = auVar38._0_4_;
            pfVar18 = pfVar10 + lVar30;
            lVar30 = lVar30 + iVar27;
            auVar38 = vfmadd213ss_fma(ZEXT416((uint)(*pfVar18 * pfVar36[uVar22])),
                                      ZEXT416((uint)fVar43),
                                      ZEXT416((uint)pfVar17[(long)iVar33 + uVar22]));
            in_ZMM1 = ZEXT1664(auVar38);
            pfVar17[(long)iVar33 + uVar22] = auVar38._0_4_;
          }
          iVar33 = iVar33 + (int)uVar22;
          lVar34 = lVar34 + iVar5;
          pfVar36 = pfVar36 + iVar5;
        }
        iVar33 = (int)lVar34 + ((local_104 - iVar4) + iVar7) * iVar5;
      }
    }
    else {
      pfVar36 = this->gPartials[iVar5];
      iVar5 = this->kPartialsPaddedStateCount;
      uVar21 = this->kStateCount;
      uVar6 = this->kCategoryCount;
      iVar7 = this->kPatternCount;
      iVar33 = iVar5 * local_104;
      for (uVar23 = 0; uVar23 != (~((int)uVar6 >> 0x1f) & uVar6); uVar23 = uVar23 + 1) {
        auVar38._0_8_ = (double)pfVar12[uVar23];
        auVar38._8_8_ = in_ZMM1._8_8_;
        lVar28 = (long)iVar33;
        pfVar32 = pfVar36 + lVar28;
        iVar33 = this->kMatrixSize;
        uVar22 = (ulong)(uVar21 * local_104);
        for (iVar20 = local_104; iVar20 < iVar4; iVar20 = iVar20 + 1) {
          pfVar16 = this->integrationTmp;
          pfVar17 = this->firstDerivTmp;
          pfVar18 = this->secondDerivTmp;
          uVar22 = (ulong)(int)uVar22;
          uVar31 = 0;
          iVar27 = iVar33 * (int)uVar23;
          while (uVar31 != (~((int)uVar21 >> 0x1f) & uVar21)) {
            dVar37 = 0.0;
            dVar49 = 0.0;
            dVar44 = 0.0;
            for (uVar25 = 0; uVar21 != uVar25; uVar25 = uVar25 + 1) {
              fVar43 = pfVar32[uVar25];
              dVar37 = dVar37 + (double)(fVar43 * pfVar11[(long)iVar27 + uVar25]);
              dVar49 = dVar49 + (double)(fVar43 * pfVar9[(long)iVar27 + uVar25]);
              dVar44 = dVar44 + (double)(fVar43 * pfVar10[(long)iVar27 + uVar25]);
            }
            auVar54._0_8_ = (double)pfVar16[uVar22];
            auVar54._8_8_ = in_XMM6_Qb;
            iVar27 = iVar27 + uVar21 + 1;
            auVar51._8_8_ = 0;
            auVar51._0_8_ = dVar37 * (double)pfVar14[lVar28 + uVar31];
            auVar45 = vfmadd231sd_fma(auVar54,auVar38,auVar51);
            pfVar16[uVar22] = (float)auVar45._0_8_;
            auVar52._0_8_ = (double)pfVar17[uVar22];
            auVar52._8_8_ = in_XMM6_Qb;
            auVar50._8_8_ = 0;
            auVar50._0_8_ = dVar49 * (double)pfVar14[lVar28 + uVar31];
            auVar45 = vfmadd231sd_fma(auVar52,auVar38,auVar50);
            pfVar17[uVar22] = (float)auVar45._0_8_;
            lVar34 = lVar28 + uVar31;
            auVar53._0_8_ = (double)pfVar18[uVar22];
            auVar53._8_8_ = in_XMM6_Qb;
            uVar31 = uVar31 + 1;
            auVar45._8_8_ = 0;
            auVar45._0_8_ = dVar44 * (double)pfVar14[lVar34];
            auVar45 = vfmadd231sd_fma(auVar53,auVar38,auVar45);
            in_ZMM1 = ZEXT1664(CONCAT124(auVar45._4_12_,(float)auVar45._0_8_));
            pfVar18[uVar22] = (float)auVar45._0_8_;
            uVar22 = uVar22 + 1;
            in_XMM4_Qb = in_XMM6_Qb;
          }
          pfVar32 = pfVar32 + iVar5;
          lVar28 = lVar28 + iVar5;
        }
        iVar33 = (int)lVar28 + ((local_104 - iVar4) + iVar7) * iVar5;
      }
    }
    local_104 = local_104 * this->kStateCount;
    for (lVar28 = lVar24; lVar28 < lVar29; lVar28 = lVar28 + 1) {
      lVar34 = (long)local_104;
      auVar38 = ZEXT816(0) << 0x40;
      auVar45 = ZEXT816(0) << 0x40;
      auVar50 = ZEXT816(0) << 0x40;
      uVar21 = ~(this->kStateCount >> 0x1f) & this->kStateCount;
      for (uVar23 = 0; uVar21 != uVar23; uVar23 = uVar23 + 1) {
        fVar43 = pfVar13[uVar23];
        auVar38 = vfmadd231ss_fma(auVar38,ZEXT416((uint)fVar43),
                                  ZEXT416((uint)this->integrationTmp[lVar34 + uVar23]));
        auVar45 = vfmadd231ss_fma(auVar45,ZEXT416((uint)fVar43),
                                  ZEXT416((uint)this->firstDerivTmp[lVar34 + uVar23]));
        auVar50 = vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar43),
                                  ZEXT416((uint)this->secondDerivTmp[lVar34 + uVar23]));
      }
      local_104 = local_104 + uVar21;
      fVar43 = auVar38._0_4_;
      dVar37 = log((double)fVar43);
      this->outLogLikelihoodsTmp[lVar28] = (float)dVar37;
      auVar39._0_4_ = auVar45._0_4_ / fVar43;
      auVar39._4_12_ = SUB6012((undefined1  [60])0x0,0);
      this->outFirstDerivativesTmp[lVar28] = auVar39._0_4_;
      auVar38 = vfnmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ / fVar43)),auVar39,auVar39);
      in_ZMM1 = ZEXT1664(auVar38);
      this->outSecondDerivativesTmp[lVar28] = auVar38._0_4_;
    }
    if (iVar26 != -1) {
      pfVar9 = this->outLogLikelihoodsTmp;
      pfVar10 = this->gScaleBuffers[iVar26];
      for (lVar28 = lVar24; lVar28 < lVar29; lVar28 = lVar28 + 1) {
        pfVar9[lVar28] = pfVar10[lVar28] + pfVar9[lVar28];
      }
    }
    outSumLogLikelihoodByPartition[uVar35] = 0.0;
    outSumFirstDerivativeByPartition[uVar35] = 0.0;
    outSumSecondDerivativeByPartition[uVar35] = 0.0;
    pdVar19 = this->gPatternWeights;
    pfVar9 = this->outLogLikelihoodsTmp;
    pfVar10 = this->outFirstDerivativesTmp;
    pfVar11 = this->outSecondDerivativesTmp;
    while (lVar24 < lVar29) {
      auVar40._0_8_ = (double)pfVar9[lVar24];
      auVar40._8_8_ = in_XMM4_Qb;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = pdVar19[lVar24];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = outSumLogLikelihoodByPartition[uVar35];
      auVar38 = vfmadd213sd_fma(auVar46,auVar40,auVar1);
      outSumLogLikelihoodByPartition[uVar35] = auVar38._0_8_;
      auVar41._0_8_ = (double)pfVar10[lVar24];
      auVar41._8_8_ = in_XMM4_Qb;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = pdVar19[lVar24];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = outSumFirstDerivativeByPartition[uVar35];
      auVar38 = vfmadd213sd_fma(auVar47,auVar41,auVar2);
      outSumFirstDerivativeByPartition[uVar35] = auVar38._0_8_;
      auVar42._0_8_ = (double)pfVar11[lVar24];
      auVar42._8_8_ = in_XMM4_Qb;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = pdVar19[lVar24];
      lVar24 = lVar24 + 1;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = outSumSecondDerivativeByPartition[uVar35];
      auVar38 = vfmadd213sd_fma(auVar48,auVar42,auVar3);
      in_ZMM1 = ZEXT1664(auVar38);
      outSumSecondDerivativeByPartition[uVar35] = auVar38._0_8_;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsSecondDerivByPartition(
                                                  const int* parentBufferIndices,
                                                  const int* childBufferIndices,
                                                  const int* probabilityIndices,
                                                  const int* firstDerivativeIndices,
                                                  const int* secondDerivativeIndices,
                                                  const int* categoryWeightsIndices,
                                                  const int* stateFrequenciesIndices,
                                                  const int* cumulativeScaleIndices,
                                                  const int* partitionIndices,
                                                  int partitionCount,
                                                  double* outSumLogLikelihoodByPartition,
                                                  double* outSumFirstDerivativeByPartition,
                                                  double* outSumSecondDerivativeByPartition) {


    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        memset(&integrationTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));
        memset(&firstDerivTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));
        memset(&secondDerivTmp[startPattern*kStateCount], 0, ((endPattern - startPattern) * kStateCount)*sizeof(REALTYPE));

        const int parIndex = parentBufferIndices[p];
        const int childIndex = childBufferIndices[p];
        const int probIndex = probabilityIndices[p];
        const int firstDerivativeIndex = firstDerivativeIndices[p];
        const int secondDerivativeIndex = secondDerivativeIndices[p];
        const int categoryWeightsIndex = categoryWeightsIndices[p];
        const int stateFrequenciesIndex = stateFrequenciesIndices[p];
        const int scalingFactorsIndex = cumulativeScaleIndices[p];

        assert(parIndex >= kTipCount);

        const REALTYPE* partialsParent = gPartials[parIndex];
        const REALTYPE* transMatrix = gTransitionMatrices[probIndex];
        const REALTYPE* firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];
        const REALTYPE* secondDerivMatrix = gTransitionMatrices[secondDerivativeIndex];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];
            int v = startPattern * kPartialsPaddedStateCount; // Index for parent partials

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {

                    const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                    // so we can interchange the patterCount and categoryCount loop order?
                    int w =  l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        firstDerivTmp[u] += firstDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        secondDerivTmp[u] += secondDerivMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        u++;

                        w += kTransPaddedStateCount;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }

        } else { // Integrate against a partial at the child

            const REALTYPE* partialsChild = gPartials[childIndex];
            int v = startPattern * kPartialsPaddedStateCount;

            for(int l = 0; l < kCategoryCount; l++) {
                int u = startPattern * kStateCount;
                const REALTYPE weight = wt[l];
                for(int k = startPattern; k < endPattern; k++) {
                    int w = l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        double sumOverJ = 0.0;
                        double sumOverJD1 = 0.0;
                        double sumOverJD2 = 0.0;
                        for(int j = 0; j < kStateCount; j++) {
                            sumOverJ += transMatrix[w] * partialsChild[v + j];
                            sumOverJD1 += firstDerivMatrix[w] * partialsChild[v + j];
                            sumOverJD2 += secondDerivMatrix[w] * partialsChild[v + j];
                            w++;
                        }

                        // increment for the extra column at the end
                        w += T_PAD;

                        integrationTmp[u] += sumOverJ * partialsParent[v + i] * weight;
                        firstDerivTmp[u] += sumOverJD1 * partialsParent[v + i] * weight;
                        secondDerivTmp[u] += sumOverJD2 * partialsParent[v + i] * weight;
                        u++;
                    }
                    v += kPartialsPaddedStateCount;
                }
                v += ((kPatternCount - endPattern) + startPattern) * kPartialsPaddedStateCount;
            }
        }

        int u = startPattern * kStateCount;
        for(int k = startPattern; k < endPattern; k++) {
            REALTYPE sumOverI = 0.0;
            REALTYPE sumOverID1 = 0.0;
            REALTYPE sumOverID2 = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * integrationTmp[u];
                sumOverID1 += freqs[i] * firstDerivTmp[u];
                sumOverID2 += freqs[i] * secondDerivTmp[u];
                u++;
            }

            outLogLikelihoodsTmp[k] = log(sumOverI);
            outFirstDerivativesTmp[k] = sumOverID1 / sumOverI;
            outSecondDerivativesTmp[k] = sumOverID2 / sumOverI - outFirstDerivativesTmp[k] * outFirstDerivativesTmp[k];
        }


        if (scalingFactorsIndex != BEAGLE_OP_NONE) {
            const REALTYPE* scalingFactors = gScaleBuffers[scalingFactorsIndex];
            for(int k=startPattern; k < endPattern; k++)
                outLogLikelihoodsTmp[k] += scalingFactors[k];
        }


        outSumLogLikelihoodByPartition[p] = 0.0;
        outSumFirstDerivativeByPartition[p] = 0.0;
        outSumSecondDerivativeByPartition[p] = 0.0;
        for (int i = startPattern; i < endPattern; i++) {
            outSumLogLikelihoodByPartition[p]    += outLogLikelihoodsTmp[i]    * gPatternWeights[i];
            outSumFirstDerivativeByPartition[p]  += outFirstDerivativesTmp[i]  * gPatternWeights[i];
            outSumSecondDerivativeByPartition[p] += outSecondDerivativesTmp[i] * gPatternWeights[i];
        }

    }
}